

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

FLOW_HANDLE
flow_create(uint32_t incoming_window_value,transfer_number next_outgoing_id_value,
           uint32_t outgoing_window_value)

{
  int iVar1;
  FLOW_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  AMQP_VALUE item_value_01;
  FLOW_INSTANCE *flow_instance;
  
  __ptr = (FLOW_HANDLE)malloc(8);
  if (__ptr == (FLOW_HANDLE)0x0) {
    return (FLOW_HANDLE)0x0;
  }
  value = amqpvalue_create_composite_with_ulong_descriptor(0x13);
  __ptr->composite_value = value;
  if (value == (AMQP_VALUE)0x0) goto LAB_0011f818;
  item_value = amqpvalue_create_uint(incoming_window_value);
  iVar1 = amqpvalue_set_composite_item(value,1,item_value);
  item_value_00 = amqpvalue_create_uint(next_outgoing_id_value);
  if (iVar1 == 0) {
    iVar1 = amqpvalue_set_composite_item(value,2,item_value_00);
    item_value_01 = amqpvalue_create_uint(outgoing_window_value);
    if (iVar1 != 0) goto LAB_0011f7f8;
    iVar1 = amqpvalue_set_composite_item(value,3,item_value_01);
    amqpvalue_destroy(item_value);
    amqpvalue_destroy(item_value_00);
    amqpvalue_destroy(item_value_01);
    if (iVar1 == 0) {
      return __ptr;
    }
  }
  else {
    item_value_01 = amqpvalue_create_uint(outgoing_window_value);
LAB_0011f7f8:
    amqpvalue_destroy(item_value);
    amqpvalue_destroy(item_value_00);
    amqpvalue_destroy(item_value_01);
  }
  amqpvalue_destroy(value);
LAB_0011f818:
  free(__ptr);
  return (FLOW_HANDLE)0x0;
}

Assistant:

FLOW_HANDLE flow_create(uint32_t incoming_window_value, transfer_number next_outgoing_id_value, uint32_t outgoing_window_value)
{
    FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)malloc(sizeof(FLOW_INSTANCE));
    if (flow_instance != NULL)
    {
        flow_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(19);
        if (flow_instance->composite_value == NULL)
        {
            free(flow_instance);
            flow_instance = NULL;
        }
        else
        {
            AMQP_VALUE incoming_window_amqp_value;
            AMQP_VALUE next_outgoing_id_amqp_value;
            AMQP_VALUE outgoing_window_amqp_value;
            int result = 0;

            incoming_window_amqp_value = amqpvalue_create_uint(incoming_window_value);
            if ((result == 0) && (amqpvalue_set_composite_item(flow_instance->composite_value, 1, incoming_window_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            next_outgoing_id_amqp_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
            if ((result == 0) && (amqpvalue_set_composite_item(flow_instance->composite_value, 2, next_outgoing_id_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            outgoing_window_amqp_value = amqpvalue_create_uint(outgoing_window_value);
            if ((result == 0) && (amqpvalue_set_composite_item(flow_instance->composite_value, 3, outgoing_window_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(incoming_window_amqp_value);
            amqpvalue_destroy(next_outgoing_id_amqp_value);
            amqpvalue_destroy(outgoing_window_amqp_value);
            if (result != 0)
            {
                flow_destroy(flow_instance);
                flow_instance = NULL;
            }
        }
    }

    return flow_instance;
}